

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

uint __thiscall Parser::CalculateFunctionColumnNumber(Parser *this)

{
  ParseNodeFnc *pPVar1;
  ParseableFunctionInfo *pPVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  uint uVar5;
  
  cVar3 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinTok(&this->m_scan);
  cVar4 = Scanner<UTF8EncodingPolicyBase<false>_>::IchMinLine(&this->m_scan);
  uVar5 = cVar3 - cVar4;
  if (cVar3 < cVar4) {
    pPVar1 = this->m_currentNodeFunc;
    if (pPVar1 == (ParseNodeFnc *)0x0) {
      uVar5 = 0;
    }
    else {
      uVar5 = (cVar3 - (pPVar1->super_ParseNode).ichMin) + pPVar1->columnNumber;
    }
  }
  else {
    pPVar2 = this->m_functionBody;
    if ((pPVar2 != (ParseableFunctionInfo *)0x0) && (pPVar2->m_lineNumber == (this->m_scan).m_line))
    {
      uVar5 = uVar5 + pPVar2->m_columnNumber;
    }
  }
  return uVar5;
}

Assistant:

uint Parser::CalculateFunctionColumnNumber()
{
    uint columnNumber;

    charcount_t ichMinTok = this->GetScanner()->IchMinTok();
    charcount_t ichMinLine = this->GetScanner()->IchMinLine();
    if (ichMinTok >= ichMinLine)
    {
        // In scenarios involving defer parse IchMinLine() can be incorrect for the first line after defer parse
        columnNumber = ichMinTok - ichMinLine;
        if (m_functionBody != nullptr && m_functionBody->GetRelativeLineNumber() == this->GetScanner()->LineCur())
        {
            // Adjust the column if it falls on the first line, where the re-parse is happening.
            columnNumber += m_functionBody->GetRelativeColumnNumber();
        }
    }
    else if (m_currentNodeFunc)
    {
        // For the first line after defer parse, compute the column relative to the column number
        // of the lexically parent function.
        ULONG offsetFromCurrentFunction = ichMinTok - m_currentNodeFunc->ichMin;
        columnNumber = m_currentNodeFunc->columnNumber + offsetFromCurrentFunction;
    }
    else
    {
        // if there is no current function, lets give a default of 0.
        columnNumber = 0;
    }

    return columnNumber;
}